

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O1

void Eigen::internal::queryCacheSizes(int *l1,int *l2,int *l3)

{
  long lVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  lVar1 = cpuid_basic_info(0);
  iVar4 = *(int *)(lVar1 + 4);
  iVar6 = *(int *)(lVar1 + 8);
  iVar7 = *(int *)(lVar1 + 0xc);
  if (iVar7 == 0x6c65746e && (iVar6 == 0x49656e69 && iVar4 == 0x756e6547)) {
    *l3 = 0;
    *l2 = 0;
    *l1 = 0;
    uVar9 = 0;
    do {
      puVar2 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
      uVar3 = *puVar2;
      uVar5 = puVar2[1];
      if (((uVar3 & 0xd) == 1) &&
         (((uVar10 = uVar3 >> 5 & 7, piVar8 = l1, uVar10 == 1 || (piVar8 = l3, uVar10 == 3)) ||
          (piVar8 = l2, uVar10 == 2)))) {
        *piVar8 = (puVar2[3] + 1) * ((uVar5 >> 0x16) + 1) *
                  ((uVar5 & 0xfff) + 1) * ((uVar5 >> 0xc & 0x3ff) + 1);
      }
    } while (((uVar3 & 0xf) != 0) && (bVar11 = uVar9 < 0xf, uVar9 = uVar9 + 1, bVar11));
  }
  else if ((iVar7 == 0x444d4163 && (iVar6 == 0x69746e65 && iVar4 == 0x68747541)) ||
          (iVar7 == 0x21726574 && (iVar6 == 0x74656273 && iVar4 == 0x69444d41))) {
    lVar1 = cpuid(0x80000005);
    *l1 = *(int *)(lVar1 + 0xc) >> 0xe & 0xfffffc00;
    lVar1 = cpuid(0x80000006);
    iVar4 = *(int *)(lVar1 + 8);
    *l2 = *(int *)(lVar1 + 0xc) >> 6 & 0xfffffc00;
    *l3 = iVar4 * 2 & 0x1ff80000;
  }
  else {
    if (iVar4 < 4) {
      queryCacheSizes_intel_codes(l1,l2,l3);
      return;
    }
    *l3 = 0;
    *l2 = 0;
    *l1 = 0;
    uVar9 = 0;
    do {
      puVar2 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
      uVar3 = *puVar2;
      uVar5 = puVar2[1];
      if (((uVar3 & 0xd) == 1) &&
         (((uVar10 = uVar3 >> 5 & 7, piVar8 = l1, uVar10 == 1 || (piVar8 = l3, uVar10 == 3)) ||
          (piVar8 = l2, uVar10 == 2)))) {
        *piVar8 = (puVar2[3] + 1) * ((uVar5 >> 0x16) + 1) *
                  ((uVar5 & 0xfff) + 1) * ((uVar5 >> 0xc & 0x3ff) + 1);
      }
    } while (((uVar3 & 0xf) != 0) && (bVar11 = uVar9 < 0xf, uVar9 = uVar9 + 1, bVar11));
  }
  return;
}

Assistant:

inline void queryCacheSizes(int& l1, int& l2, int& l3)
{
  #ifdef EIGEN_CPUID
  int abcd[4];
  const int GenuineIntel[] = {0x756e6547, 0x49656e69, 0x6c65746e};
  const int AuthenticAMD[] = {0x68747541, 0x69746e65, 0x444d4163};
  const int AMDisbetter_[] = {0x69444d41, 0x74656273, 0x21726574}; // "AMDisbetter!"

  // identify the CPU vendor
  EIGEN_CPUID(abcd,0x0,0);
  int max_std_funcs = abcd[1];
  if(cpuid_is_vendor(abcd,GenuineIntel))
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);
  else if(cpuid_is_vendor(abcd,AuthenticAMD) || cpuid_is_vendor(abcd,AMDisbetter_))
    queryCacheSizes_amd(l1,l2,l3);
  else
    // by default let's use Intel's API
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);

  // here is the list of other vendors:
//   ||cpuid_is_vendor(abcd,"VIA VIA VIA ")
//   ||cpuid_is_vendor(abcd,"CyrixInstead")
//   ||cpuid_is_vendor(abcd,"CentaurHauls")
//   ||cpuid_is_vendor(abcd,"GenuineTMx86")
//   ||cpuid_is_vendor(abcd,"TransmetaCPU")
//   ||cpuid_is_vendor(abcd,"RiseRiseRise")
//   ||cpuid_is_vendor(abcd,"Geode by NSC")
//   ||cpuid_is_vendor(abcd,"SiS SiS SiS ")
//   ||cpuid_is_vendor(abcd,"UMC UMC UMC ")
//   ||cpuid_is_vendor(abcd,"NexGenDriven")
  #else
  l1 = l2 = l3 = -1;
  #endif
}